

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultReporterFactory.cpp
# Opt level: O0

shared_ptr<ApprovalTests::Reporter> * ApprovalTests::DefaultReporterFactory::defaultReporter(void)

{
  int iVar1;
  shared_ptr<ApprovalTests::DiffReporter> *in_stack_ffffffffffffffd8;
  shared_ptr<ApprovalTests::Reporter> *in_stack_ffffffffffffffe0;
  
  if (defaultReporter()::reporter == '\0') {
    iVar1 = __cxa_guard_acquire(&defaultReporter()::reporter);
    if (iVar1 != 0) {
      ::std::make_shared<ApprovalTests::DiffReporter>();
      ::std::shared_ptr<ApprovalTests::Reporter>::shared_ptr<ApprovalTests::DiffReporter,void>
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      ::std::shared_ptr<ApprovalTests::DiffReporter>::~shared_ptr
                ((shared_ptr<ApprovalTests::DiffReporter> *)0x12af25);
      __cxa_atexit(::std::shared_ptr<ApprovalTests::Reporter>::~shared_ptr,
                   &defaultReporter::reporter,&__dso_handle);
      __cxa_guard_release(&defaultReporter()::reporter);
    }
  }
  return &defaultReporter::reporter;
}

Assistant:

std::shared_ptr<Reporter>& DefaultReporterFactory::defaultReporter()
    {
        static std::shared_ptr<Reporter> reporter = std::make_shared<DiffReporter>();
        return reporter;
    }